

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffedit_columns(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  void *__ptr;
  char *pcVar10;
  fitsfile *pfVar11;
  long lVar12;
  ulong uVar13;
  int colnum;
  char *file_expr;
  int tstatus;
  char *clause;
  char *tstbuff;
  int local_25c;
  int numcols;
  int testnum;
  char *local_250;
  int hdunum;
  int status_del;
  undefined8 local_240;
  char *cptr3;
  char *local_230;
  char *local_228;
  fitsfile *newptr;
  char colname [71];
  char oldname [71];
  char colformat [71];
  char cStack_129;
  char testname [71];
  char keyname [75];
  char card [81];
  
  colnum = -1;
  numcols = 0;
  tstatus = 0;
  tstbuff = (char *)0x0;
  clause = (char *)0x0;
  file_expr = (char *)0x0;
  if (*outfile != '\0') {
    iVar4 = ffinit(&newptr,outfile,status);
    if (iVar4 < 1) {
      ffghdn(*fptr,&hdunum);
      pfVar11 = *fptr;
      if (pfVar11->Fptr->only_one == 0) {
        iVar4 = 1;
        while (iVar5 = ffmahd(pfVar11,iVar4,(int *)0x0,status), iVar5 < 1) {
          ffcopy(*fptr,newptr,0,status);
          iVar4 = iVar4 + 1;
          pfVar11 = *fptr;
        }
        pfVar11 = newptr;
        if (*status == 0x6b) {
          *status = 0;
        }
        else if (0 < *status) goto LAB_0010ba6a;
      }
      else {
        ffmahd(pfVar11,1,(int *)0x0,status);
        ffcopy(*fptr,newptr,0,status);
        ffmahd(*fptr,hdunum,(int *)0x0,status);
        ffcopy(*fptr,newptr,0,status);
        if (0 < *status) {
LAB_0010ba6a:
          ffclos(newptr,status);
          pcVar10 = "failed to copy all HDUs from input file (ffedit_columns)";
          goto LAB_0010baa8;
        }
        hdunum = 2;
        pfVar11 = newptr;
      }
      ffclos(*fptr,status);
      *fptr = pfVar11;
      iVar4 = ffmahd(pfVar11,hdunum,(int *)0x0,status);
      if (iVar4 < 1) goto LAB_0010bac1;
      pcVar10 = "failed to copy the input file (ffedit_columns)";
    }
    else {
      pcVar10 = "failed to create file for copy (ffedit_columns)";
    }
LAB_0010baa8:
    ffpmsg(pcVar10);
LAB_0010baad:
    return *status;
  }
LAB_0010bac1:
  for (pcVar10 = expr + 4; *pcVar10 == ' '; pcVar10 = pcVar10 + 1) {
  }
  if (*pcVar10 == '@') {
    local_230 = pcVar10;
    iVar4 = ffimport_file(pcVar10 + 1,&file_expr,status);
    if (iVar4 != 0) goto LAB_0010baad;
    pcVar9 = file_expr + -1;
    do {
      pcVar10 = pcVar9 + 1;
      pcVar8 = pcVar9 + 1;
      pcVar9 = pcVar10;
    } while (*pcVar8 == ' ');
  }
  tstatus = 0;
  local_230 = pcVar10;
  ffgncl(*fptr,&numcols,&tstatus);
  iVar4 = comma2semicolon(pcVar10);
  if (iVar4 != 0) {
    ffpmsg("parsing error in column filter expression");
    ffpmsg(pcVar10);
    free(file_expr);
    *status = 0x1af;
    return 0x1af;
  }
  local_240 = 0;
  local_25c = 0;
  __ptr = (void *)0x0;
LAB_0010bb76:
  pcVar10 = colname;
  uVar6 = fits_get_token2(&local_230,";",&clause,(int *)0x0,status);
  pcVar9 = clause;
  if ((int)uVar6 < 1) goto LAB_0010c3fc;
  if (*local_230 == ';') {
    local_230 = local_230 + 1;
  }
  clause[uVar6] = '\0';
  if ((*clause != '-') && (*clause != '!')) {
    local_250 = clause;
    iVar4 = fits_get_token2(&local_250,"( =",&tstbuff,(int *)0x0,status);
    pcVar8 = tstbuff;
    if ((iVar4 == 0) || (*status != 0)) {
      ffpmsg("error: column or keyword name is blank (ffedit_columns):");
      ffpmsg(pcVar9);
      free(__ptr);
      free(file_expr);
      free(clause);
      if (*status != 0) {
        return *status;
      }
      goto LAB_0010c5a8;
    }
    sVar7 = strlen(tstbuff);
    if (sVar7 < 0x47) {
      strcpy(pcVar10,pcVar8);
      free(pcVar8);
      tstbuff = (char *)0x0;
      if (colname[0] == '#') {
        pcVar8 = strchr(colname + 1,0x23);
        sVar7 = strlen(pcVar10);
        if (pcVar8 != colname + (sVar7 - 1)) goto LAB_0010bc77;
        if (0 < colnum) {
          pcVar10[sVar7 - 1] = '\0';
          pcVar10 = colname + 1;
          ffkeyn(pcVar10,colnum,oldname,status);
          if (*status != 0) {
            return *status;
          }
LAB_0010bf42:
          strcpy(pcVar10,oldname);
          goto LAB_0010bf4f;
        }
        ffpmsg("The keyword name:");
        ffpmsg(colname);
        ffpmsg("is invalid unless a column has been previously");
        ffpmsg("created or editted by a calculator command");
        free(file_expr);
      }
      else {
LAB_0010bc77:
        pcVar8 = strchr(pcVar10,0x23);
        sVar7 = strlen(pcVar10);
        if ((pcVar8 == colname + (sVar7 - 1)) && (0 < colnum)) {
          tstatus = 0;
          ffgcno(*fptr,0,pcVar10,&testnum,&tstatus);
          if ((tstatus != 0) && (tstatus != 0xed)) {
            ffcmsg();
            strcpy(testname,pcVar10);
            sVar7 = strlen(testname);
            testname[sVar7 - 1] = '\0';
            ffkeyn(testname,colnum,oldname,status);
            if (*status != 0) {
              free(file_expr);
              goto LAB_0010c5e1;
            }
            tstatus = 0;
            iVar4 = ffgcrd(*fptr,oldname,card,&tstatus);
            if (iVar4 == 0) goto LAB_0010bf42;
          }
        }
LAB_0010bf4f:
        if (*local_250 != '(') {
LAB_0010bfee:
          do {
            pcVar8 = local_250;
            pcVar10 = pcVar8 + 1;
            local_250 = pcVar10;
          } while (*pcVar8 == ' ');
          if (*pcVar8 == '=') {
            if (*pcVar10 == '=') {
              pcVar10 = pcVar8 + 2;
              do {
                local_250 = pcVar10;
                pcVar10 = local_250 + 1;
              } while (*local_250 == ' ');
              iVar4 = fits_get_token2(&local_250," ",&tstbuff,(int *)0x0,status);
              pcVar10 = tstbuff;
              if (iVar4 == 0) {
                oldname[0] = '\0';
              }
              else {
                sVar7 = strlen(tstbuff);
                if (0x46 < sVar7) {
                  pcVar8 = "error: column name syntax is too long (ffedit_columns):";
                  goto LAB_0010c589;
                }
                local_228 = pcVar10;
                strcpy(oldname,pcVar10);
                free(local_228);
                tstbuff = (char *)0x0;
              }
              iVar4 = ffgcno(*fptr,0,oldname,&colnum,status);
              if (0 < iVar4) {
                ffcmsg();
                *status = 0;
                iVar4 = ffmnam(*fptr,oldname,colname,status);
                if (0 < iVar4) {
                  pcVar10 = "column or keyword to be renamed does not exist:";
                  goto LAB_0010c5bd;
                }
                goto LAB_0010c36b;
              }
              ffkeyn("TTYPE",colnum,keyname,status);
              iVar4 = ffmkys(*fptr,keyname,colname,(char *)0x0,status);
              if (0 < iVar4) {
                ffpmsg("failed to rename column in input file");
                ffpmsg(" oldname =");
                ffpmsg(oldname);
                ffpmsg(" newname =");
                pcVar9 = colname;
                goto LAB_0010c5c5;
              }
              if (__ptr == (void *)0x0) {
                __ptr = calloc(999,4);
              }
              *(undefined4 *)((long)__ptr + (long)colnum * 4 + -4) = 1;
              local_25c = 1;
              goto LAB_0010c36b;
            }
            colformat[0] = '\0';
            cptr3 = colname;
            iVar4 = fits_get_token2(&cptr3,"(",&tstbuff,(int *)0x0,status);
            pcVar9 = tstbuff;
            if (iVar4 != 0) {
              sVar7 = strlen(tstbuff);
              if (sVar7 < 0x47) {
                strcpy(oldname,pcVar9);
                free(pcVar9);
                tstbuff = (char *)0x0;
                goto LAB_0010c232;
              }
LAB_0010c539:
              pcVar9 = "column expression is too long (ffedit_columns)";
              goto LAB_0010c4a7;
            }
            oldname[0] = '\0';
LAB_0010c232:
            if (*cptr3 == '(') {
              cptr3 = cptr3 + 1;
              iVar4 = fits_get_token2(&cptr3,")",&tstbuff,(int *)0x0,status);
              pcVar9 = tstbuff;
              if (iVar4 == 0) {
                colformat[0] = '\0';
              }
              else {
                sVar7 = strlen(tstbuff);
                if (0x46 < sVar7) goto LAB_0010c539;
                strcpy(colformat,pcVar9);
                free(pcVar9);
                tstbuff = (char *)0x0;
              }
            }
            iVar4 = ffcalc(*fptr,pcVar10,*fptr,oldname,colformat,status);
            if (0 < iVar4) {
              pcVar9 = "Unable to calculate expression";
              goto LAB_0010c5c5;
            }
            tstatus = 0;
            ffgcno(*fptr,0,oldname,&testnum,&tstatus);
            if (tstatus != 0) {
              ffcmsg();
              goto LAB_0010c36b;
            }
            lVar12 = (long)testnum;
            colnum = testnum;
            if (__ptr == (void *)0x0) {
              __ptr = calloc(999,4);
            }
            *(undefined4 *)((long)__ptr + lVar12 * 4 + -4) = 1;
            if (numcols < colnum) {
              numcols = numcols + 1;
            }
          }
          else {
            local_250 = pcVar8;
            ffgcno(*fptr,0,colname,&testnum,status);
            iVar4 = *status;
            iVar5 = local_25c;
            while (iVar4 == 0xed) {
              lVar12 = (long)testnum;
              colnum = testnum;
              if (__ptr == (void *)0x0) {
                __ptr = calloc(999,4);
              }
              *(undefined4 *)((long)__ptr + lVar12 * 4 + -4) = 1;
              ffgcno(*fptr,0,colname,&testnum,status);
              iVar4 = *status;
              iVar5 = 1;
              if (iVar4 == 0xdb) {
                *status = 999;
                iVar4 = 999;
                iVar5 = 1;
              }
            }
            if (0 < iVar4) {
              if (iVar4 == 999) {
LAB_0010c12e:
                local_25c = iVar5;
                *status = 0;
                goto LAB_0010c36b;
              }
              ffpmsg("Syntax error in columns specifier in input URL:");
              ffpmsg(pcVar8);
              free(__ptr);
              free(file_expr);
              pcVar9 = clause;
              goto LAB_0010c5a3;
            }
            lVar12 = (long)testnum;
            colnum = testnum;
            if (__ptr == (void *)0x0) {
              __ptr = calloc(999,4);
            }
            *(undefined4 *)((long)__ptr + lVar12 * 4 + -4) = 1;
          }
          local_25c = 1;
          goto LAB_0010c36b;
        }
        iVar4 = fits_get_token2(&local_250,")",&tstbuff,(int *)0x0,status);
        pcVar10 = tstbuff;
        if (iVar4 == 0) {
          sVar7 = strlen(colname);
          (colname + sVar7)[0] = ')';
          (colname + sVar7)[1] = '\0';
LAB_0010bfe6:
          local_250 = local_250 + 1;
          goto LAB_0010bfee;
        }
        local_228 = (char *)strlen(tstbuff);
        sVar7 = strlen(colname);
        if ((char *)0xffffffffffffffb8 < local_228 + (sVar7 - 0x46)) {
          strcat(colname,pcVar10);
          sVar7 = strlen(colname);
          (colname + sVar7)[0] = ')';
          (colname + sVar7)[1] = '\0';
          free(pcVar10);
          tstbuff = (char *)0x0;
          goto LAB_0010bfe6;
        }
        pcVar8 = "error: column name is too long (ffedit_columns):";
LAB_0010c589:
        ffpmsg(pcVar8);
        free(file_expr);
        free(pcVar9);
        pcVar9 = pcVar10;
      }
    }
    else {
      ffpmsg("error: column or keyword name is too long (ffedit_columns):");
LAB_0010c4a7:
      ffpmsg(pcVar9);
      free(__ptr);
      free(file_expr);
      free(clause);
      pcVar9 = tstbuff;
    }
LAB_0010c5a3:
    free(pcVar9);
LAB_0010c5a8:
    *status = 0x7d;
    return 0x7d;
  }
  pcVar10 = clause + 1;
  cVar1 = clause[1];
  if (cVar1 == '\0') {
    uVar6 = 0;
  }
  else {
    sVar7 = strlen(pcVar10);
    uVar6 = (uint)sVar7;
  }
  if ((*status == 0) && (1 < (int)uVar6)) {
    if (cVar1 == '#') goto LAB_0010be4a;
    if (pcVar9[uVar6] != '+') goto LAB_0010bdee;
    pcVar9[uVar6] = '\0';
    do {
      status_del = 0;
      *status = 0;
      ffgcno(*fptr,0,pcVar10,&colnum,status);
      if ((*status != 0xed) && (*status != 0)) goto LAB_0010bde1;
      iVar4 = ffdcol(*fptr,colnum,&status_del);
      if (0 < iVar4) {
        ffpmsg("failed to delete column in input file:");
        ffpmsg(pcVar9);
        free(__ptr);
        free(file_expr);
        free(clause);
        *status = status_del;
        return status_del;
      }
      numcols = numcols + -1;
      local_240 = 1;
    } while (*status == 0xed);
    local_240 = 1;
LAB_0010bde1:
    *status = 0;
    colnum = -1;
  }
  else {
LAB_0010bdee:
    if (((cVar1 != '\0') && (cVar1 != '#')) &&
       ((iVar4 = ffgcno(*fptr,0,pcVar10,&colnum,status), iVar4 < 1 || (*status == 0xed)))) {
      *status = 0;
      iVar4 = ffdcol(*fptr,colnum,status);
      if (iVar4 < 1) {
        numcols = numcols + -1;
        colnum = -1;
        local_240 = 1;
        goto LAB_0010c36b;
      }
      pcVar10 = "failed to delete column in input file:";
LAB_0010c5bd:
      ffpmsg(pcVar10);
      goto LAB_0010c5c5;
    }
LAB_0010be4a:
    ffcmsg();
    *status = 0;
    if (pcVar9[1] == '#') {
      pcVar10 = pcVar9 + 2;
    }
    sVar7 = strlen(pcVar10);
    bVar3 = true;
    if ((1 < (int)sVar7) && (uVar6 = (int)sVar7 - 1, pcVar10[uVar6] == '+')) {
      pcVar10[uVar6] = '\0';
      bVar3 = false;
    }
    pcVar9 = strchr(pcVar10,0x3f);
    if (((pcVar9 != (char *)0x0) || (pcVar9 = strchr(pcVar10,0x2a), pcVar9 != (char *)0x0)) ||
       (pcVar9 = strchr(pcVar10,0x23), pcVar9 != (char *)0x0)) {
      ffmaky(*fptr,1,status);
    }
    do {
      iVar4 = ffdkey(*fptr,pcVar10,status);
      if (0 < iVar4) {
        if ((!bVar3) && (*status == 0xca)) {
          ffcmsg();
          iVar5 = local_25c;
          goto LAB_0010c12e;
        }
        ffpmsg("column or keyword to be deleted does not exist:");
        pcVar9 = pcVar10;
        goto LAB_0010c5c5;
      }
      bVar2 = !bVar3;
      bVar3 = false;
    } while (bVar2);
  }
LAB_0010c36b:
  free(clause);
  clause = (char *)0x0;
  goto LAB_0010bb76;
LAB_0010c3fc:
  if ((int)local_240 == 0 && local_25c != 0) {
    uVar13 = (ulong)(uint)numcols;
LAB_0010c419:
    if (0 < (int)uVar13) {
      if ((*(int *)((long)__ptr + uVar13 * 4 + -4) != 0) ||
         (iVar4 = ffdcol(*fptr,(int)uVar13,status), iVar4 < 1)) goto LAB_0010c440;
      ffpmsg("failed to delete column in input file:");
      pcVar9 = clause;
LAB_0010c5c5:
      ffpmsg(pcVar9);
    }
  }
  free(__ptr);
  free(file_expr);
  pcVar9 = clause;
LAB_0010c5e1:
  free(pcVar9);
  goto LAB_0010baad;
LAB_0010c440:
  uVar13 = uVar13 - 1;
  goto LAB_0010c419;
}

Assistant:

int ffedit_columns(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - column edit expression    */
           int *status)
/*
   modify columns in a table and/or header keywords in the HDU
*/
{
    fitsfile *newptr;
    int ii, hdunum, slen, colnum = -1, testnum, deletecol = 0, savecol = 0;
    int numcols = 0, *colindex = 0, tstatus = 0;
    char *tstbuff=0, *cptr, *cptr2, *cptr3, *clause = NULL, keyname[FLEN_KEYWORD];
    char colname[FLEN_VALUE], oldname[FLEN_VALUE], colformat[FLEN_VALUE];
    char *file_expr = NULL, testname[FLEN_VALUE], card[FLEN_CARD];

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg("failed to create file for copy (ffedit_columns)");
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all HDUs to the output copy, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)
        {
          *status = 0;              /* got the expected EOF error; reset = 0  */
        }
        else if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }


      } else {
        /* only copy the primary array and the designated table extension */
	fits_movabs_hdu(*fptr, 1, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
	fits_movabs_hdu(*fptr, hdunum, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
        if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      if (fits_movabs_hdu(*fptr, hdunum, NULL, status) > 0)
      {
         ffpmsg("failed to copy the input file (ffedit_columns)");
         return(*status);
      }
    }

    /* remove the "col " from the beginning of the column edit expression */
    cptr = expr + 4;

    while (*cptr == ' ')
         cptr++;         /* skip leading white space */
   
    /* Check if need to import expression from a file */

    if( *cptr=='@' ) {
       if( ffimport_file( cptr+1, &file_expr, status ) ) return(*status);
       cptr = file_expr;
       while (*cptr == ' ')
          cptr++;         /* skip leading white space... again */
    }

    tstatus = 0;
    ffgncl(*fptr, &numcols, &tstatus);  /* get initial # of cols */

    /* as of July 2012, the CFITSIO column filter syntax was modified */
    /* so that commas may be used to separate clauses, as well as semi-colons. */
    /* This was done because users cannot enter the semi-colon in the HEASARC's */
    /* Hera on-line data processing system for computer security reasons.  */
    /* Therefore, we must convert those commas back to semi-colons here, but we */
    /* must not convert any columns that occur within parenthesies.  */

    if (comma2semicolon(cptr)) {
         ffpmsg("parsing error in column filter expression");
         ffpmsg(cptr);
         if( file_expr ) free( file_expr );
         *status = PARSE_SYNTAX_ERR;
         return(*status);
    }

    /* parse expression and get first clause, if more than 1 */
    while ((slen = fits_get_token2(&cptr, ";", &clause, NULL, status)) > 0 )
    {
        if( *cptr==';' ) cptr++;
        clause[slen] = '\0';

        if (clause[0] == '!' || clause[0] == '-')
        {
	    char *clause1 = clause+1;
	    int clen = clause1[0] ? strlen(clause1) : 0;
            /* ===================================== */
            /* Case I. delete this column or keyword */
            /* ===================================== */

	    /* Case Ia. delete column names with 0-or-more wildcard
	            -COLNAME+ - delete repeated columns with exact name
		    -COLNAM*+ - delete columns matching patterns
	    */
	    if (*status == 0 &&
		clen > 1 && clause1[0] != '#' &&
		clause1[clen-1] == '+') {

	      clause1[clen-1] = 0; clen--;

	      /* Note that this is a delete 0 or more specification,
		 which means that no matching columns is not an error. */
	      do {
		int status_del = 0;

		/* Have to set status=0 so we can reset the search at
		   start column.  Because we are deleting columns on
		   the fly here, we have to reset the search every
		   time. The only penalty here is execution time
		   because leaving *status == COL_NOT_UNIQUE is merely
		   an optimization for tables assuming the tables do
		   not change from one call to the next. (an
		   assumption broken in this loop) */
		*status = 0; 
		ffgcno(*fptr, CASEINSEN, clause1, &colnum, status);
		/* ffgcno returns COL_NOT_UNIQUE if there are multiple columns,
		   and COL_NOT_FOUND after the last column is found, and 
		   COL_NOT_FOUND if no matches were found */
		if (*status != 0 && *status != COL_NOT_UNIQUE) break;
		
                if (ffdcol(*fptr, colnum, &status_del) > 0) {
		  ffpmsg("failed to delete column in input file:");
		  ffpmsg(clause);
		  if( colindex ) free( colindex );
		  if( file_expr ) free( file_expr );
		  if( clause ) free(clause);
		  return (*status = status_del);
		}
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
	      } while (*status == COL_NOT_UNIQUE);

	      *status = 0; /* No matches are still successful */
	      colnum = -1; /* Ignore the column we found */

	    /* Case Ib. delete column names with wildcard or not
	            -COLNAME  - deleted exact column
		    -COLNAM*  - delete first column that matches pattern
	       Note no leading '#'
	    */
	    } else if (clause1[0] && clause1[0] != '#' &&
		       ((ffgcno(*fptr, CASEINSEN, clause1, &colnum, status) <= 0) ||
			*status == COL_NOT_UNIQUE))
            {
                /* a column with this name exists, so try to delete it */
	        *status = 0; /* Clear potential status=COL_NOT_UNIQUE */
                if (ffdcol(*fptr, colnum, status) > 0)
                {
                    ffpmsg("failed to delete column in input file:");
                    ffpmsg(clause);
                    if( colindex ) free( colindex );
                    if( file_expr ) free( file_expr );
		    if( clause ) free(clause);
                    return(*status);
                }
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
                colnum = -1;
            }
	    /* Case Ic. delete keyword(s)
	            -KEYNAME,#KEYNAME  - delete exact keyword (first match)
		    -KEYNAM*,#KEYNAM*  - delete first matching keyword
		    -KEYNAME+,-#KEYNAME+ - delete 0-or-more exact matches of exact keyword
		    -KEYNAM*+,-#KEYNAM*+ - delete 0-or-more wildcard matches 
	       Note the preceding # is optional if no conflicting column name exists
	       and that wildcard patterns are described in "colfilter" section of
	       documentation.
	    */
            else
            {
	      int delall = 0;
	      int haswild = 0;
	        ffcmsg();   /* clear previous error message from ffgcno */
                /* try deleting a keyword with this name */
                *status = 0;
		/* skip past leading '#' if any */
		if (clause1[0] == '#') clause1++;
		clen = strlen(clause1);

		/* Repeat deletion of keyword if requested with trailing '+' */
		if (clen > 1 && clause1[clen-1] == '+') {
		  delall = 1;
		  clause1[clen-1] = 0;
		}
		/* Determine if this pattern has wildcards */
		if (strchr(clause1,'?') || strchr(clause1,'*') || strchr(clause1,'#')) {
		  haswild = 1;
		}

		if (haswild) {
		  /* ffdkey() behaves differently if the pattern has a wildcard:
		     it only checks from the "current" header position to the end, and doesn't
		     check before the "current" header position.  Therefore, for the
		     case of wildcards we will have to reset to the beginning. */
		  ffmaky(*fptr, 1, status);  /* reset pointer to beginning of header */
		}

		/* Single or repeated deletions until done */
		do {
		  if (ffdkey(*fptr, clause1, status) > 0)
		    {
		      if (delall && *status == KEY_NO_EXIST) {
			/* Found last wildcard item. Stop deleting */
			ffcmsg();
			*status = 0;
			delall = 0; /* Force end of this loop */
		      } else {
			/* This was not a wildcard deletion, or it resulted in
			   another kind of error */
			ffpmsg("column or keyword to be deleted does not exist:");
			ffpmsg(clause1);
			if( colindex ) free( colindex );
			if( file_expr ) free( file_expr );
			if( clause ) free(clause);
			return(*status);
		      }
		    }
		} while(delall); /* end do{} */
            }
        }
        else
        {
            /* ===================================================== */
            /* Case II:
	       this is either a column name, (case 1) 

               or a new column name followed by double = ("==") followed
               by the old name which is to be renamed. (case 2A)

               or a column or keyword name followed by a single "=" and a
	       calculation expression (case 2B) */
            /* ===================================================== */
            cptr2 = clause;
            slen = fits_get_token2(&cptr2, "( =", &tstbuff, NULL, status);

            if (slen == 0 || *status)
            {
                ffpmsg("error: column or keyword name is blank (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                if (*status==0)
                   *status=URL_PARSE_ERROR;
                return(*status);
            }
            if (strlen(tstbuff) > FLEN_VALUE-1)
            {
                ffpmsg("error: column or keyword name is too long (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                free(tstbuff);
                return(*status= URL_PARSE_ERROR);
            }
            strcpy(colname, tstbuff);
            free(tstbuff);
            tstbuff=0;

	    /* If this is a keyword of the form 
	         #KEYWORD# 
	       then transform to the form
	         #KEYWORDn
	       where n is the previously used column number 
	    */
	    if (colname[0] == '#' &&
		strstr(colname+1, "#") == (colname + strlen(colname) - 1)) 
	    {
		if (colnum <= 0) 
		  {
		    ffpmsg("The keyword name:");
		    ffpmsg(colname);
		    ffpmsg("is invalid unless a column has been previously");
		    ffpmsg("created or editted by a calculator command");
                    if( file_expr ) free( file_expr );
		    if (clause) free(clause);
		    return(*status = URL_PARSE_ERROR);
		  }
		colname[strlen(colname)-1] = '\0';
		/* Make keyword name and put it in oldname */
		ffkeyn(colname+1, colnum, oldname, status);
		if (*status) return (*status);
		/* Re-copy back into colname */
		strcpy(colname+1,oldname);
	    }
            else if  (strstr(colname, "#") == (colname + strlen(colname) - 1)) 
	    {
	        /*  colname is of the form "NAME#";  if
		      a) colnum is defined, and
		      b) a column with literal name "NAME#" does not exist, and
		      c) a keyword with name "NAMEn" (where n=colnum) exists, then
		    transfrom the colname string to "NAMEn", otherwise
		    do nothing.
		*/
		if (colnum > 0) {  /* colnum must be defined */
		  tstatus = 0;
                  ffgcno(*fptr, CASEINSEN, colname, &testnum, &tstatus);
		  if (tstatus != 0 && tstatus != COL_NOT_UNIQUE) 
		  {  
		    /* OK, column doesn't exist, now see if keyword exists */
		    ffcmsg();   /* clear previous error message from ffgcno */
		    strcpy(testname, colname);
 		    testname[strlen(testname)-1] = '\0';
		    /* Make keyword name and put it in oldname */
		    ffkeyn(testname, colnum, oldname, status);
		    if (*status) {
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
		      return (*status);
		    }

		    tstatus = 0;
		    if (!fits_read_card(*fptr, oldname, card, &tstatus)) {
		      /* Keyword does exist; copy real name back into colname */
		      strcpy(colname,oldname);
		    }
		  }
                }
	    }

            /* if we encountered an opening parenthesis, then we need to */
            /* find the closing parenthesis, and concatinate the 2 strings */
            /* This supports expressions like:
                [col #EXTNAME(Extension name)="GTI"]
            */
            if (*cptr2  == '(')
            {
                if (fits_get_token2(&cptr2, ")", &tstbuff, NULL, status)==0)
                {
                   strcat(colname,")");
                }
                else
                {
                   if ((strlen(tstbuff) + strlen(colname) + 1) >
                        FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcat(colname, tstbuff);
                   strcat(colname, ")");
                   free(tstbuff);
                   tstbuff=0;
                }
                cptr2++;
            }

            while (*cptr2 == ' ')
                 cptr2++;         /* skip white space */

            if (*cptr2 != '=')
            {
              /* ------------------------------------ */
              /* case 1 - simply the name of a column */
              /* ------------------------------------ */

              /* look for matching column */
              ffgcno(*fptr, CASEINSEN, colname, &testnum, status);
	      
              while (*status == COL_NOT_UNIQUE) 
              {
                 /* the column name contained wild cards, and it */
                 /* matches more than one column in the table. */
		 
		 colnum = testnum;

                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */

                 /* look for other matching column names */
                 ffgcno(*fptr, CASEINSEN, colname, &testnum, status);

                 if (*status == COL_NOT_FOUND)
                    *status = 999;  /* temporary status flag value */
              }

              if (*status <= 0)
              {
	         colnum = testnum;
		 
                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */
              }
              else if (*status == 999)
              {
                  /* this special flag value does not represent an error */
                  *status = 0;  
              }
              else
              {
               ffpmsg("Syntax error in columns specifier in input URL:");
               ffpmsg(cptr2);
               if( colindex ) free( colindex );
               if( file_expr ) free( file_expr );
	       if (clause) free(clause);
               return(*status = URL_PARSE_ERROR);
              }
            }
            else
            {
              /* ----------------------------------------------- */
              /* case 2 where the token ends with an equals sign */
              /* ----------------------------------------------- */

              cptr2++;   /* skip over the first '=' */

              if (*cptr2 == '=')
              {
                /*................................................. */
                /*  Case A:  rename a column or keyword;  syntax is
                    "new_name == old_name"  */
                /*................................................. */

                cptr2++;  /* skip the 2nd '=' */
                while (*cptr2 == ' ')
                      cptr2++;       /* skip white space */

                if (fits_get_token2(&cptr2, " ", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name syntax is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                /* get column number of the existing column */
                if (ffgcno(*fptr, CASEINSEN, oldname, &colnum, status) <= 0)
                {
                    /* modify the TTYPEn keyword value with the new name */
                    ffkeyn("TTYPE", colnum, keyname, status);

                    if (ffmkys(*fptr, keyname, colname, NULL, status) > 0)
                    {
                      ffpmsg("failed to rename column in input file");
                      ffpmsg(" oldname =");
                      ffpmsg(oldname);
                      ffpmsg(" newname =");
                      ffpmsg(colname);
                      if( colindex ) free( colindex );
                      if( file_expr ) free( file_expr );
	              if (clause) free(clause);
                      return(*status);
                    }
                    /* keep this column in the output file */
                    savecol = 1;
                    if (!colindex)
                       colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;  /* flag this column number */
                }
                else
                {
                    /* try renaming a keyword */
		    ffcmsg();   /* clear error message stack */
                    *status = 0;
                    if (ffmnam(*fptr, oldname, colname, status) > 0)
                    {
                      ffpmsg("column or keyword to be renamed does not exist:");
                        ffpmsg(clause);
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                        return(*status);
                    }
                }
              }  
              else
              {
                /*...................................................... */
                /* Case B: */
                /* this must be a general column/keyword calc expression */
                /* "name = expression" or "colname(TFORM) = expression" */
                /*...................................................... */

                /* parse the name and TFORM values, if present */
                colformat[0] = '\0';
                cptr3 = colname;

                if (fits_get_token2(&cptr3, "(", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                         ffpmsg("column expression is too long (ffedit_columns)");
                         if( colindex ) free( colindex );
                         if( file_expr ) free( file_expr );
		         if (clause) free(clause);
                         free(tstbuff);
                         *status=URL_PARSE_ERROR;
                         return(*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                if (cptr3[0] == '(' )
                {
                   cptr3++;  /* skip the '(' */
                   if (fits_get_token2(&cptr3, ")", &tstbuff, NULL, status)==0)
                   {
                      colformat[0]=0;
                   }
                   else
                   {
                      if (strlen(tstbuff) > FLEN_VALUE-1)
                      {
                            ffpmsg("column expression is too long (ffedit_columns)");
                            if( colindex ) free( colindex );
                            if( file_expr ) free( file_expr );
		            if (clause) free(clause);
                            free(tstbuff);
                            *status=URL_PARSE_ERROR;
                            return(*status);
                      }
                      strcpy(colformat, tstbuff);
                      free(tstbuff);
                      tstbuff=0;
                   }
                }

                /* calculate values for the column or keyword */
                /*   cptr2 = the expression to be calculated */
                /*   oldname = name of the column or keyword */
                /*   colformat = column format, or keyword comment string */
                if (fits_calculator(*fptr, cptr2, *fptr, oldname, colformat,
       	                        status) > 0) {
				
                        ffpmsg("Unable to calculate expression");
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                         return(*status);
                }

                /* test if this is a column and not a keyword */
                tstatus = 0;
                ffgcno(*fptr, CASEINSEN, oldname, &testnum, &tstatus);
                if (tstatus == 0)
                {
                    /* keep this column in the output file */
		    colnum = testnum;
                    savecol = 1;

                    if (!colindex)
                      colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;
                    if (colnum > numcols)numcols++;
                }
		else
		{
		   ffcmsg();  /* clear the error message stack */
		}
              }
            }
        }
	if (clause) free(clause);  /* free old clause before getting new one */
        clause = NULL;
    }

    if (savecol && !deletecol)
    {
       /* need to delete all but the specified columns */
       for (ii = numcols; ii > 0; ii--)
       {
         if (!colindex[ii-1])  /* delete this column */
         {
           if (ffdcol(*fptr, ii, status) > 0)
           {
             ffpmsg("failed to delete column in input file:");
             ffpmsg(clause);
             if( colindex ) free( colindex );
             if( file_expr ) free( file_expr );
	     if (clause) free(clause);
             return(*status);
           }
         }
       }
    }

    if( colindex ) free( colindex );
    if( file_expr ) free( file_expr );
    if (clause) free(clause);

    return(*status);
}